

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::~file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this)

{
  bool bVar1;
  size_t size;
  FILE *pFVar2;
  buffer<char> *in_RDI;
  _IO_FILE *f;
  bool flush;
  glibc_file<_IO_FILE> *in_stack_ffffffffffffffc8;
  
  size = buffer<char>::size(in_RDI);
  glibc_file<_IO_FILE>::advance_write_buffer((glibc_file<_IO_FILE> *)(in_RDI + 1),size);
  bVar1 = glibc_file<_IO_FILE>::needs_flush(in_stack_ffffffffffffffc8);
  pFVar2 = (FILE *)file_base::operator_cast_to__IO_FILE_((file_base *)(in_RDI + 1));
  funlockfile(pFVar2);
  if (bVar1) {
    pFVar2 = (FILE *)file_base::operator_cast_to__IO_FILE_((file_base *)(in_RDI + 1));
    fflush(pFVar2);
  }
  return;
}

Assistant:

~file_print_buffer() {
    file_.advance_write_buffer(size());
    bool flush = file_.needs_flush();
    F* f = file_;    // Make funlockfile depend on the template parameter F
    funlockfile(f);  // for the system API detection to work.
    if (flush) fflush(file_);
  }